

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

void caxpy(int n,complex<float> ca,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  undefined4 in_register_0000000c;
  long lVar1;
  undefined8 *puVar2;
  undefined4 in_register_0000003c;
  complex<float> z;
  int iVar3;
  int iVar4;
  long lVar5;
  complex<float> *__y;
  bool bVar6;
  float fVar7;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  complex<float> local_38;
  complex<float> ca_local;
  
  iVar3 = (int)cy;
  z._M_value._4_4_ = in_register_0000003c;
  z._M_value._0_4_ = n;
  lVar1 = CONCAT44(in_register_0000000c,incx);
  if (0 < n) {
    fVar7 = cabs1(z);
    if ((fVar7 != 0.0) || (NAN(fVar7))) {
      iVar4 = (int)cx;
      if (iVar3 == 1 && iVar4 == 1) {
        for (lVar5 = 0; (ulong)(uint)n << 3 != lVar5; lVar5 = lVar5 + 8) {
          std::operator*(&local_38,(complex<float> *)(ca._M_value + lVar5));
          *(ulong *)(lVar1 + lVar5) =
               CONCAT44((float)((ulong)*(undefined8 *)(lVar1 + lVar5) >> 0x20) + extraout_XMM0_Db_00
                        ,(float)*(undefined8 *)(lVar1 + lVar5) + extraout_XMM0_Da_00);
        }
      }
      else {
        __y = (complex<float> *)(ca._M_value + (long)(iVar4 >> 0x1f & (1 - n) * iVar4) * 8);
        puVar2 = (undefined8 *)(lVar1 + (long)(iVar3 >> 0x1f & (1 - n) * iVar3) * 8);
        while (bVar6 = n != 0, n = n + -1, bVar6) {
          std::operator*(&local_38,__y);
          *puVar2 = CONCAT44((float)((ulong)*puVar2 >> 0x20) + extraout_XMM0_Db,
                             (float)*puVar2 + extraout_XMM0_Da);
          __y = __y + iVar4;
          puVar2 = puVar2 + iVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void caxpy ( int n, complex <float> ca, complex <float> cx[],
  int incx, complex <float> cy[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CAXPY computes a constant times a vector plus a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <float> CA, the multiplier of CX.
//
//    Input, complex <float> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], the second vector.
//    On output, CY(*) has been replaced by CY(*) + CA * CX(*).
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( cabs1 ( ca ) == 0.0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cy[iy] + ca * cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cy[i] + ca * cx[i];
    }

  }

  return;
}